

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendGarbage
          (V2TransportTester *this,Span<const_unsigned_char> garbage)

{
  long lVar1;
  pointer puVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_sent_garbage,
             garbage.m_data,garbage.m_data + garbage.m_size);
  puVar2 = (this->m_sent_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    data.m_size = (long)(this->m_sent_garbage).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2;
    data.m_data = puVar2;
    Send(this,data);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendGarbage(Span<const uint8_t> garbage)
    {
        // Remember the specified garbage (so we can use it as AAD).
        m_sent_garbage.assign(garbage.begin(), garbage.end());
        // Schedule it for sending.
        Send(m_sent_garbage);
    }